

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,string *flag)

{
  bool bVar1;
  ostream *poVar2;
  ExtraError *this_00;
  string local_1b0;
  ostringstream problem;
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    if (((this->super_NamedBase).field_0x51 == '\x01') &&
       ((this->super_NamedBase).super_Base.matched == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
      poVar2 = std::operator<<((ostream *)&problem,"Flag \'");
      poVar2 = std::operator<<(poVar2,(string *)flag);
      std::operator<<(poVar2,"\' was passed multiple times, but is only allowed to be passed once");
      this_00 = (ExtraError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      ExtraError::ExtraError(this_00,&local_1b0);
      __cxa_throw(this_00,&ExtraError::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->super_NamedBase).super_Base.matched = true;
  }
  else {
    this = (FlagBase *)0x0;
  }
  return this;
}

Assistant:

virtual FlagBase *Match(const std::string &flag)
            {
                if (matcher.Match(flag))
                {
                    if (extraError && matched)
                    {
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
#else
                        std::ostringstream problem;
                        problem << "Flag '" << flag << "' was passed multiple times, but is only allowed to be passed once";
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }